

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int decode(uint64_t *in,uint8_t *out,size_t l,uint64_t q)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  
  iVar1 = -1;
  if (out != (uint8_t *)0x0 && in != (uint64_t *)0x0) {
    lVar2 = (ulong)((l & 7) != 0) + (l >> 3);
    if (lVar2 != 0) {
      lVar5 = 0;
      do {
        out[lVar5] = '\0';
        if (l == 0) {
          l = 0;
        }
        else {
          uVar4 = l - 1;
          if (6 < uVar4) {
            uVar4 = 7;
          }
          bVar3 = 7;
          bVar6 = 0;
          lVar7 = 0;
          do {
            bVar6 = bVar6 | (in[lVar7] <= q - (q >> 2) && q >> 2 <= in[lVar7]) << (bVar3 & 0x1f);
            out[lVar5] = bVar6;
            lVar7 = lVar7 + 1;
            bVar3 = bVar3 - 1;
          } while (uVar4 + 1 != lVar7);
          l = l - lVar7;
        }
        lVar5 = lVar5 + 1;
        in = in + 8;
      } while (lVar5 != lVar2);
      return 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int decode(uint64_t in[], uint8_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define thresholds
    uint64_t t1 = q/4;
    uint64_t t2 = q - q/4;

    // compute number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and decode input
    for(size_t by = 0; by < num_bytes; by++) {
        out[by] = 0;
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            uint8_t val = (in[by*8+bi] < t1 || in[by*8+bi] > t2) ? 0 : 1;
            out[by] |= val << (7-bi);
            l--;
        }
    }

    return 0;
}